

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

_Bool is16BitEquivalent(uint orig,uint equiv)

{
  bool bVar1;
  uint16_t idx;
  size_t i;
  uint equiv_local;
  uint orig_local;
  _Bool local_1;
  
  if (x86_16_bit_eq_lookup[orig] == 0) {
LAB_00356bcd:
    local_1 = false;
  }
  else {
    i = (size_t)(int)(x86_16_bit_eq_lookup[orig] - 1);
    while( true ) {
      bVar1 = false;
      if (i < 0x465) {
        bVar1 = x86_16_bit_eq_tbl[i].first == orig;
      }
      if (!bVar1) goto LAB_00356bcd;
      if (x86_16_bit_eq_tbl[i].second == equiv) break;
      i = i + 1;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool is16BitEquivalent(unsigned orig, unsigned equiv)
{
	size_t i;
	uint16_t idx;

	if ((idx = x86_16_bit_eq_lookup[orig]) != 0) {
		for (i = idx - 1; i < ARR_SIZE(x86_16_bit_eq_tbl) && x86_16_bit_eq_tbl[i].first == orig; i++) {
			if (x86_16_bit_eq_tbl[i].second == equiv)
				return true;
		}
	}

	return false;
}